

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_math.c
# Opt level: O1

int SUNRCompareTol(realtype a,realtype b,realtype tol)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  iVar1 = 0;
  if ((a != b) || (NAN(a) || NAN(b))) {
    iVar1 = 1;
    if ((ABS(b) != INFINITY) && ((ABS(a) != INFINITY && (!NAN(a) && !NAN(b))))) {
      dVar2 = ABS(a + b);
      if (1.79769313486232e+308 <= dVar2) {
        dVar2 = 1.79769313486232e+308;
      }
      dVar3 = 2.220446049250313e-15;
      if (2.220446049250313e-15 <= dVar2 * tol) {
        dVar3 = dVar2 * tol;
      }
      return (int)(dVar3 <= ABS(a - b));
    }
  }
  return iVar1;
}

Assistant:

booleantype SUNRCompareTol(realtype a, realtype b, realtype tol)
{
  realtype diff;
  realtype norm;

  /* If a and b are exactly equal.
   * This also covers the case where a and b are both inf under IEEE 754.
   */
  if (a == b) return(SUNFALSE);

  /* If a or b are NaN */
  if (sunIsNaN(a) || sunIsNaN(b)) return(SUNTRUE);

  /* If one of a or b are Inf (since we handled both being inf above) */
  if (sunIsInf(a) || sunIsInf(b)) return(SUNTRUE);

  diff = SUNRabs(a - b);
  norm = SUNMIN(SUNRabs(a + b), BIG_REAL);

  /* When |a + b| is very small (less than 10*UNIT_ROUNDOFF) or zero, we use an
   * absolute difference:
   *    |a - b| >= 10*UNIT_ROUNDOFF
   * Otherwise we use a relative difference:
   *    |a - b| < tol * |a + b|
   * The choice to use |a + b| over max(a, b)
   * is arbitrary, as is the choice to use
   * 10*UNIT_ROUNDOFF.
   */
  return(diff >= SUNMAX(10*UNIT_ROUNDOFF, tol*norm));
}